

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meaning.h
# Opt level: O3

void __thiscall
ConditionalMeaning::TracePointers(ConditionalMeaning *this,function<void_(Sexp_**)> *func)

{
  Sexp **local_28;
  
  local_28 = &this->condition;
  if ((func->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*func->_M_invoker)((_Any_data *)func,&local_28);
    local_28 = &this->true_branch;
    if ((func->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*func->_M_invoker)((_Any_data *)func,&local_28);
      local_28 = &this->false_branch;
      if ((func->super__Function_base)._M_manager != (_Manager_type)0x0) {
        (*func->_M_invoker)((_Any_data *)func,&local_28);
        return;
      }
    }
  }
  std::__throw_bad_function_call();
}

Assistant:

void TracePointers(std::function<void(Sexp **)> func) override {
    func(&condition);
    func(&true_branch);
    func(&false_branch);
  }